

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O1

Vec_Int_t * Acb_ReadWeightMap(char *pFileName,Abc_Nam_t *pNames)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  int *__s;
  char *__s_00;
  char *pStr;
  char *__nptr;
  
  iVar1 = Abc_NamObjNumMax(pNames);
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  iVar3 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar3 = iVar1;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar3;
  if (iVar3 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar3 << 2);
  }
  pVVar4->pArray = __s;
  pVVar4->nSize = iVar1;
  if (__s != (int *)0x0) {
    memset(__s,0xff,(long)iVar1 << 2);
  }
  __s_00 = Extra_FileReadContents(pFileName);
  if (__s_00 == (char *)0x0) {
    pVVar4 = (Vec_Int_t *)0x0;
  }
  else {
    pStr = strtok(__s_00,"  \n\r(),");
    __nptr = strtok((char *)0x0,"  \n\r(),");
    while (pStr != (char *)0x0) {
      uVar2 = Abc_NamStrFind(pNames,pStr);
      if ((int)uVar2 < 1) {
        printf("Cannot find name \"%s\" among node names of this network.\n",pStr);
      }
      else {
        if (pVVar4->nSize <= (int)uVar2) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        iVar3 = atoi(__nptr);
        pVVar4->pArray[uVar2] = iVar3;
        pStr = strtok((char *)0x0,"  \n\r(),;");
        __nptr = strtok((char *)0x0,"  \n\r(),;");
      }
    }
    free(__s_00);
  }
  return pVVar4;
}

Assistant:

Vec_Int_t * Acb_ReadWeightMap( char * pFileName, Abc_Nam_t * pNames )
{
    Vec_Int_t * vWeights = Vec_IntStartFull( Abc_NamObjNumMax(pNames) );
    char * pBuffer = Extra_FileReadContents( pFileName );
    char * pToken, * pNum;
    if ( pBuffer == NULL )
        return NULL;
    pToken = strtok( pBuffer, "  \n\r()," );
    pNum   = strtok( NULL, "  \n\r()," );
    while ( pToken )
    {
        int NameId = Abc_NamStrFind(pNames, pToken);
        int Number = atoi(pNum);
        if ( NameId <= 0 )
        {
            printf( "Cannot find name \"%s\" among node names of this network.\n", pToken );
            continue;
        }
        Vec_IntWriteEntry( vWeights, NameId, Number );
        pToken = strtok( NULL, "  \n\r(),;" );
        pNum = strtok( NULL, "  \n\r(),;" );
    }
    ABC_FREE( pBuffer );
    return vWeights;
}